

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

int __thiscall ncnn::Yolov3DetectionOutput::load_param(Yolov3DetectionOutput *this,ParamDict *pd)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  float fVar5;
  Mat local_a8;
  Mat local_68;
  
  iVar4 = ParamDict::get(pd,0,0x14);
  this->num_class = iVar4;
  iVar4 = ParamDict::get(pd,1,5);
  this->num_box = iVar4;
  fVar5 = ParamDict::get(pd,2,0.01);
  this->confidence_threshold = fVar5;
  fVar5 = ParamDict::get(pd,3,0.45);
  this->nms_threshold = fVar5;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&local_a8,pd,4,&local_68);
  if (&this->biases != &local_a8) {
    piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->biases).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->biases).data;
        pAVar3 = (this->biases).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
    (this->biases).data = (void *)0x0;
    (this->biases).refcount = (int *)0x0;
    (this->biases).dims = 0;
    (this->biases).w = 0;
    (this->biases).h = 0;
    (this->biases).c = 0;
    (this->biases).cstep = 0;
    (this->biases).data = local_a8.data;
    (this->biases).refcount = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    (this->biases).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
    (this->biases).packing = local_a8.packing;
    (this->biases).allocator = local_a8.allocator;
    (this->biases).dims = local_a8.dims;
    (this->biases).w = local_a8.w;
    (this->biases).h = local_a8.h;
    (this->biases).c = local_a8.c;
    (this->biases).cstep = local_a8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_a8.allocator + 0x18))();
      }
    }
  }
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.packing = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.c = 0;
  local_a8.cstep = 0;
  piVar1 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&local_a8,pd,5,&local_68);
  if (&this->mask != &local_a8) {
    piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->mask).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->mask).data;
        pAVar3 = (this->mask).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->mask).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->mask).elemsize + 4) = 0;
    (this->mask).data = (void *)0x0;
    (this->mask).refcount = (int *)0x0;
    (this->mask).dims = 0;
    (this->mask).w = 0;
    (this->mask).h = 0;
    (this->mask).c = 0;
    (this->mask).cstep = 0;
    (this->mask).data = local_a8.data;
    (this->mask).refcount = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    (this->mask).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
    (this->mask).packing = local_a8.packing;
    (this->mask).allocator = local_a8.allocator;
    (this->mask).dims = local_a8.dims;
    (this->mask).w = local_a8.w;
    (this->mask).h = local_a8.h;
    (this->mask).c = local_a8.c;
    (this->mask).cstep = local_a8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_a8.allocator + 0x18))();
      }
    }
  }
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.packing = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.c = 0;
  local_a8.cstep = 0;
  piVar1 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&local_a8,pd,6,&local_68);
  if (&this->anchors_scale != &local_a8) {
    piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->anchors_scale).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->anchors_scale).data;
        pAVar3 = (this->anchors_scale).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->anchors_scale).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->anchors_scale).elemsize + 4) = 0;
    (this->anchors_scale).data = (void *)0x0;
    (this->anchors_scale).refcount = (int *)0x0;
    (this->anchors_scale).dims = 0;
    (this->anchors_scale).w = 0;
    (this->anchors_scale).h = 0;
    (this->anchors_scale).c = 0;
    (this->anchors_scale).cstep = 0;
    (this->anchors_scale).data = local_a8.data;
    (this->anchors_scale).refcount =
         (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    (this->anchors_scale).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize)
    ;
    (this->anchors_scale).packing = local_a8.packing;
    (this->anchors_scale).allocator = local_a8.allocator;
    (this->anchors_scale).dims = local_a8.dims;
    (this->anchors_scale).w = local_a8.w;
    (this->anchors_scale).h = local_a8.h;
    (this->anchors_scale).c = local_a8.c;
    (this->anchors_scale).cstep = local_a8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_a8.allocator + 0x18))();
      }
    }
  }
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.packing = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.c = 0;
  local_a8.cstep = 0;
  piVar1 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int Yolov3DetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 20);
    num_box = pd.get(1, 5);
    confidence_threshold = pd.get(2, 0.01f);
    nms_threshold = pd.get(3, 0.45f);
    biases = pd.get(4, Mat());
    mask = pd.get(5, Mat());
    anchors_scale = pd.get(6, Mat());
    return 0;
}